

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

bool __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
::has_next(Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
           *this,bool all_cofacets)

{
  long *plVar1;
  simplex_t *psVar2;
  char k;
  pointer prVar3;
  pointer prVar4;
  vertex_diameter_t *pvVar5;
  pointer piVar6;
  simplex_t sVar7;
  byte bVar8;
  pointer prVar9;
  vertex_diameter_t *pvVar10;
  simplex_t *psVar11;
  simplex_t *psVar12;
  bool k_00;
  int iVar13;
  long extraout_RDX;
  long extraout_RDX_00;
  vertex_diameter_t *__b;
  vertex_diameter_t *pvVar14;
  size_t idx;
  ulong uVar15;
  
  prVar3 = (this->neighbor_it).
           super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar4 = (this->neighbor_end).
           super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar14 = (prVar3->current)._M_current;
  prVar9 = prVar3;
  while( true ) {
    uVar15 = 1;
    pvVar5 = (prVar4->current)._M_current;
    if (pvVar14 == pvVar5) break;
    iVar13 = pvVar14[-1].i;
    (this->neighbor).i = iVar13;
    (this->neighbor).d = pvVar14[-1].d;
    while( true ) {
      if ((ulong)((long)(this->neighbor_it).
                        super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)prVar9 >> 3) <= uVar15) {
        bVar8 = this->k;
        goto LAB_001218ae;
      }
      pvVar10 = (this->neighbor_end).
                super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].current._M_current;
      __b = prVar9[uVar15].current._M_current;
      while( true ) {
        __b = __b + -1;
        if (__b->i <= iVar13) break;
        prVar9[uVar15].current._M_current = __b;
        if (__b == pvVar10) goto LAB_0012188a;
      }
      if (__b->i != iVar13) break;
      pvVar10 = std::max<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>
                          (&this->neighbor,__b);
      iVar13 = pvVar10->i;
      (this->neighbor).i = iVar13;
      (this->neighbor).d = pvVar10->d;
      uVar15 = uVar15 + 1;
      prVar9 = (this->neighbor_it).
               super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    pvVar14 = (prVar3->current)._M_current + -1;
    (prVar3->current)._M_current = pvVar14;
  }
LAB_0012188a:
  k_00 = false;
LAB_0012188c:
  return (bool)(pvVar14 != pvVar5 & k_00);
LAB_001218ae:
  if ((char)bVar8 < '\x01') goto LAB_00121917;
  piVar6 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  k_00 = piVar6[bVar8 - 1] <= (this->neighbor).i;
  if (k_00 || !all_cofacets) goto LAB_0012188c;
  psVar11 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                      ((simplex_t *)this->simplex_encoding,
                       (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                       (ulong)(uint)piVar6[(ulong)bVar8 - 1],(int)(char)bVar8,k_00);
  psVar12 = *(simplex_t **)&this->idx_below;
  *(long *)&this->idx_below = (long)this->idx_below - (long)psVar11;
  plVar1 = (long *)((long)&this->idx_below + 8);
  *plVar1 = (*plVar1 - extraout_RDX) - (ulong)(psVar12 < psVar11);
  k = this->k;
  psVar12 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                      ((simplex_t *)this->simplex_encoding,
                       (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                       (ulong)(uint)(this->vertices).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[(long)k + -1],
                       (int)(char)(k + '\x01'),k);
  psVar2 = &this->idx_above;
  sVar7 = *psVar2;
  *(long *)psVar2 = (long)*psVar2 + (long)psVar12;
  plVar1 = (long *)((long)&this->idx_above + 8);
  *plVar1 = *plVar1 + extraout_RDX_00 + (ulong)CARRY8((ulong)sVar7,(ulong)psVar12);
  bVar8 = this->k - 1;
  this->k = bVar8;
  goto LAB_001218ae;
LAB_00121917:
  k_00 = true;
  goto LAB_0012188c;
}

Assistant:

bool has_next(bool all_cofacets = true) {
      for (auto &it0 = neighbor_it[0], &end0 = neighbor_end[0]; it0 != end0; ++it0) {
        neighbor = *it0;
        for (size_t idx = 1; idx < neighbor_it.size(); ++idx) {
          auto &it = neighbor_it[idx], end = neighbor_end[idx];
          while (get_vertex(*it) > get_vertex(neighbor))
            if (++it == end) return false;
          if (get_vertex(*it) != get_vertex(neighbor))
            goto continue_outer;
          else
            neighbor = std::max(neighbor, *it);
        }
        while (k > 0 && vertices[k - 1] > get_vertex(neighbor)) {
          if (!all_cofacets) return false;
          idx_below -= simplex_encoding(vertices[k - 1], k);
          idx_above += simplex_encoding(vertices[k - 1], k + 1);
          --k;
        }
        return true;
continue_outer:;
      }
      return false;
    }